

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O0

int __thiscall coda_url::assign_refers(coda_url *this,char *beg,uint32_t flags)

{
  char *pcVar1;
  char *__src;
  size_t __n;
  char *pcVar2;
  char *n;
  uint in_EDX;
  char *in_RSI;
  long *in_RDI;
  char *pp_1;
  char *pp;
  char *prev;
  char *p;
  size_t args_len;
  char *args;
  char *eofp;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  undefined4 in_stack_ffffffffffffffe8;
  
  __src = coda_strnchr((char *)*in_RDI,'?',(ulong)*(uint *)(in_RDI + 1));
  if (__src == (char *)0x0) {
    __src = (char *)(*in_RDI + (ulong)*(uint *)(in_RDI + 1));
  }
  __n = (*in_RDI + (ulong)*(uint *)(in_RDI + 1)) - (long)__src;
  local_40 = in_RSI;
  local_38 = in_RSI;
  n = __src;
LAB_0010a035:
  if (local_38 < n) {
    if (*local_38 == '/') {
      if ((n + -4 < local_38) ||
         (pcVar2 = coda_strnstr((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),n,(size_t)__src),
         pcVar2 == (char *)0x0)) {
        if ((n + -3 < local_38) ||
           (pcVar2 = coda_strnstr((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),n,(size_t)__src
                                 ), pcVar2 == (char *)0x0)) {
          if ((n + -2 < local_38) ||
             (pcVar2 = coda_strnstr((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),n,
                                    (size_t)__src), pcVar2 == (char *)0x0)) {
            local_40 = local_38;
            local_38 = local_38 + 1;
          }
          else {
            memmove(local_38,local_38 + 1,(long)n - (long)(local_38 + 1));
            n = n + -1;
          }
        }
        else {
          memmove(local_38,local_38 + 2,(long)n - (long)(local_38 + 2));
          n = n + -2;
        }
      }
      else {
        memmove(local_40,local_38 + 3,(long)n - (long)(local_38 + 3));
        n = n + -(long)(local_38 + (3 - (long)local_40));
        local_38 = local_40;
        local_48 = local_40;
        do {
          local_48 = local_48 + -1;
          if (local_48 < in_RSI) goto LAB_0010a035;
        } while (*local_48 != '/');
        local_40 = local_48;
      }
    }
    else {
      local_38 = local_38 + 1;
    }
    goto LAB_0010a035;
  }
  if ((local_40 == n + -3) &&
     (pcVar2 = coda_strnstr((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),n,(size_t)__src),
     pcVar2 != (char *)0x0)) {
    pcVar2 = local_40;
    if (in_RSI < local_40) {
      do {
        pcVar1 = pcVar2;
        local_50 = pcVar1 + -1;
        if (local_50 < in_RSI) goto LAB_0010a3ef;
        pcVar2 = local_50;
      } while (*local_50 != '/');
      if ((in_RSI < local_50) && ((in_EDX & 1) == 0)) {
        pcVar1 = local_50;
      }
      n = n + -(long)(local_40 + (3 - (long)pcVar1));
    }
    else {
      n = n + -2;
    }
  }
  else if ((local_40 == n + -2) &&
          (pcVar2 = coda_strnstr((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),n,(size_t)__src)
          , pcVar2 != (char *)0x0)) {
    if ((in_RSI < local_40) && ((in_EDX & 1) == 0)) {
      n = n + -2;
    }
    else {
      n = n + -1;
    }
  }
  else if ((((local_40 == n + -1) &&
            (pcVar2 = coda_strnstr((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),n,
                                   (size_t)__src), pcVar2 != (char *)0x0)) && (in_RSI < local_40))
          && ((in_EDX & 1) == 0)) {
    n = n + -1;
  }
LAB_0010a3ef:
  if (__n != 0) {
    memmove(n,__src,__n);
    n = n + __n;
  }
  *(int *)(in_RDI + 1) = (int)n - (int)*in_RDI;
  memcpy((void *)(*in_RDI + (ulong)*(uint *)(in_RDI + 1) + 1),(void *)in_RDI[2],
         (ulong)*(uint *)(in_RDI + 3));
  *(int *)(in_RDI + 3) = (int)in_RDI[3];
  in_RDI[2] = *in_RDI + (ulong)*(uint *)(in_RDI + 1) + 1;
  *(undefined1 *)(*in_RDI + (ulong)*(uint *)(in_RDI + 1)) = 0;
  *(undefined1 *)(in_RDI[2] + (ulong)*(uint *)(in_RDI + 3)) = 0;
  return 0;
}

Assistant:

int coda_url::assign_refers(char *beg, uint32_t flags)
{
	char *eofp = coda_strnchr(val_str, '?', val_len);
	if (NULL == eofp) eofp = val_str + val_len;

	char *args = eofp;
	size_t args_len = val_str + val_len - args;

	char *p = beg;
	char *prev = p;

	while (p < eofp)
	{
		if (*p == '/')
		{
			if (p <= eofp - 4 && coda_strnstr(p, "/../", 4) != 0) // /foo/../bar -> /bar
			{
				memmove(prev, p + 3, eofp - (p + 3));
				eofp -= p + 3 - prev;

				p = prev;

				for (char *pp = p - 1; pp >= beg; --pp)
				{
					if (*pp == '/')
					{
						prev = pp;
						break;
					}
				}
			}
			else if (p <= eofp - 3 && coda_strnstr(p, "/./", 3) != 0) // /foo/./bar -> /foo/bar
			{
				memmove(p, p + 2, eofp - (p + 2));
				eofp -= 2;
			}
#if 1
			/*
			 * mozilla & opera thinks that // is directory with empty name
			 * but in unix-paths // == /./ let's think as mozilla, but just comment 
			 * this code for potential future usage.
			 */
			else if (p <= eofp - 2 && coda_strnstr(p, "//", 2) != 0) // /foo//bar -> /foo/bar
			{
				memmove(p, p + 1, eofp - (p + 1));
				eofp -= 1;
			}
#endif
			else
			{
				prev = p;
				++p;
			}
		}
		else
		{
			++p;
		}
	}